

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

void mod2sparse_transpose(mod2sparse *m,mod2sparse *r)

{
  mod2sparse *in_RSI;
  mod2sparse *in_RDI;
  int i;
  mod2entry *e;
  int local_1c;
  mod2entry *local_18;
  
  if ((in_RDI->n_rows == in_RSI->n_cols) && (in_RDI->n_cols == in_RSI->n_rows)) {
    if (in_RSI == in_RDI) {
      fprintf(_stderr,"mod2sparse_transpose: Result matrix is the same as the operand\n");
      exit(1);
    }
    mod2sparse_clear(in_RSI);
    for (local_1c = 0; local_1c < in_RDI->n_rows; local_1c = local_1c + 1) {
      for (local_18 = in_RDI->rows[local_1c].right; -1 < local_18->row; local_18 = local_18->right)
      {
        mod2sparse_insert(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      }
    }
    return;
  }
  fprintf(_stderr,"mod2sparse_transpose: Matrices have incompatible dimensions\n");
  exit(1);
}

Assistant:

void mod2sparse_transpose
( mod2sparse *m,	/* Matrix to compute transpose of (left unchanged) */
  mod2sparse *r		/* Result of transpose operation */
)
{
  mod2entry *e;
  int i;

  if (mod2sparse_rows(m)!=mod2sparse_cols(r) 
   || mod2sparse_cols(m)!=mod2sparse_rows(r))
  { fprintf(stderr,
     "mod2sparse_transpose: Matrices have incompatible dimensions\n");
    exit(1);
  }

  if (r==m)
  { fprintf(stderr, 
     "mod2sparse_transpose: Result matrix is the same as the operand\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(m); i++)
  {
    e = mod2sparse_first_in_row(m,i);

    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,mod2sparse_col(e),i);
      e = mod2sparse_next_in_row(e);
    }
  }
}